

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geom.cpp
# Opt level: O2

PolarPosition * ear::toPolarPosition(CartesianPosition position)

{
  double dVar1;
  double dVar2;
  PolarPosition *in_RDI;
  double in_stack_00000008;
  double in_stack_00000010;
  double in_stack_00000018;
  Vector3d local_48;
  Vector3d local_28;
  
  dVar1 = azimuth(&local_28);
  dVar2 = elevation(&local_48);
  in_RDI->azimuth = dVar1;
  in_RDI->elevation = dVar2;
  in_RDI->distance =
       SQRT(in_stack_00000018 * in_stack_00000018 +
            in_stack_00000010 * in_stack_00000010 + in_stack_00000008 * in_stack_00000008);
  return in_RDI;
}

Assistant:

PolarPosition toPolarPosition(CartesianPosition position) {
    auto cart_array = toCartesianVector3d(position);
    return PolarPosition(azimuth(cart_array), elevation(cart_array),
                         distance(cart_array));
  }